

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Test.cpp
# Opt level: O2

void ShowDoubleVector(vector<double,_std::allocator<double>_> *inVector)

{
  ostream *poVar1;
  pointer pdVar2;
  double local_58;
  string local_50;
  
  pdVar2 = (inVector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  std::operator<<((ostream *)&std::cout,"[ ");
  for (; pdVar2 != (inVector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
    local_58 = *pdVar2;
    BoxingBaseWithRW<double,STDStreamsReader<double>,STDStreamsWriter<double>>::ToString_abi_cxx11_
              (&local_50,&local_58);
    poVar1 = std::operator<<((ostream *)&std::cout,local_50._M_dataplus._M_p);
    std::operator<<(poVar1," ");
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::operator<<((ostream *)&std::cout,"]");
  return;
}

Assistant:

static void ShowDoubleVector(const vector<double>& inVector)
{
	vector<double>::const_iterator it = inVector.begin();

	cout<<"[ ";
	for(;it != inVector.end();++it)
		cout<<Double(*it).ToString().c_str()<<" ";
	cout<<"]";	
}